

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O0

float Gia_ManPatGetQuo(Gia_Man_t *p,Vec_Int_t *vRareCounts,Vec_Wrd_t *vSims,int n,int nWords)

{
  int iVar1;
  int iVar2;
  int iVar3;
  word *p_00;
  word *pSim;
  int RareVal;
  int RareObj;
  float Incrm;
  int i;
  int RareCount;
  int RareLit;
  float Quality;
  int nWords_local;
  int n_local;
  Vec_Wrd_t *vSims_local;
  Vec_Int_t *vRareCounts_local;
  Gia_Man_t *p_local;
  
  RareCount = 0;
  iVar1 = Vec_WrdSize(vSims);
  iVar2 = Gia_ManObjNum(p);
  if (iVar1 == iVar2) {
    for (RareObj = 0; iVar1 = Vec_IntSize(vRareCounts), RareObj + 1 < iVar1; RareObj = RareObj + 2)
    {
      iVar1 = Vec_IntEntry(vRareCounts,RareObj);
      iVar2 = Vec_IntEntry(vRareCounts,RareObj + 1);
      iVar3 = Abc_Lit2Var(iVar1);
      iVar1 = Abc_LitIsCompl(iVar1);
      p_00 = Vec_WrdEntryP(vSims,iVar3 * nWords);
      iVar3 = Abc_TtGetBit(p_00,n);
      if (iVar3 == iVar1) {
        RareCount = (int)(1.0 / (float)(iVar2 + 1) + (float)RareCount);
      }
    }
    return (float)RareCount;
  }
  __assert_fail("Vec_WrdSize(vSims) == Gia_ManObjNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                ,0x7a0,"float Gia_ManPatGetQuo(Gia_Man_t *, Vec_Int_t *, Vec_Wrd_t *, int, int)");
}

Assistant:

float Gia_ManPatGetQuo( Gia_Man_t * p, Vec_Int_t * vRareCounts, Vec_Wrd_t * vSims, int n, int nWords )
{
    float Quality = 0;
    int RareLit, RareCount, i; 
    assert( Vec_WrdSize(vSims) == Gia_ManObjNum(p) );
    Vec_IntForEachEntryDouble( vRareCounts, RareLit, RareCount, i )
    {
        float Incrm = (float)1.0/(RareCount+1);
        int RareObj = Abc_Lit2Var(RareLit);
        int RareVal = Abc_LitIsCompl(RareLit);
        word * pSim = Vec_WrdEntryP( vSims, RareObj*nWords );
        if ( Abc_TtGetBit(pSim, n) == RareVal )
            Quality += Incrm;
    }
    return Quality;
}